

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O2

ReaderTablesPtr __thiscall Omega_h::build_reader_tables(Omega_h *this,Language *language)

{
  bool bVar1;
  uint uVar2;
  const_reference __lhs;
  ReaderTables *__p;
  ulong uVar3;
  ParserFail *pPVar4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint i;
  byte bVar6;
  uint uVar7;
  int iVar8;
  ReaderTablesPtr RVar9;
  GrammarPtr grammar;
  ParserInProgress local_140;
  __shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2> local_d0;
  Parser parser;
  FiniteAutomaton lexer;
  
  build_lexer(&lexer,language);
  bVar6 = 0;
  uVar7 = 0xffffffff;
  uVar5 = 0xffffffff;
  i = 0;
  uVar2 = 0xffffffff;
  while( true ) {
    iVar8 = (int)uVar5;
    if ((int)((ulong)((long)(language->tokens).
                            super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(language->tokens).
                           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) <= (int)i) break;
    __lhs = at<Omega_h::Language::Token>(&language->tokens,i);
    bVar1 = std::operator==(&__lhs->name,"INDENT");
    if (bVar1) {
      bVar6 = 1;
      bVar1 = uVar7 != 0xffffffff;
      uVar7 = i;
      if (bVar1) {
        pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_140,"ERROR: Language has two or more INDENT tokens\n",
                   (allocator *)&parser);
        ParserFail::ParserFail(pPVar4,(string *)&local_140);
        __cxa_throw(pPVar4,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
    }
    else {
      bVar1 = std::operator==(&__lhs->name,"DEDENT");
      if (bVar1) {
        uVar5 = (ulong)i;
        if (iVar8 != -1) {
          pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_140,"ERROR: Language has two or more DEDENT tokens\n",
                     (allocator *)&parser);
          ParserFail::ParserFail(pPVar4,(string *)&local_140);
          __cxa_throw(pPVar4,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
        }
      }
      else {
        bVar1 = std::operator==(&__lhs->name,"NEWLINE");
        if ((bVar1) && (bVar1 = uVar2 != 0xffffffff, uVar2 = i, bVar1)) {
          pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_140,"ERROR: Language has two or more NEWLINE tokens\n",
                     (allocator *)&parser);
          ParserFail::ParserFail(pPVar4,(string *)&local_140);
          __cxa_throw(pPVar4,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
        }
      }
    }
    i = i + 1;
  }
  if ((bVar6 & uVar7 == 0xffffffff) != 0) {
    pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_140,"ERROR: Indentation-sensitive language has no INDENT token\n",
               (allocator *)&parser);
    ParserFail::ParserFail(pPVar4,(string *)&local_140);
    __cxa_throw(pPVar4,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((iVar8 == -1 & bVar6) != 1) {
    if ((uVar2 == 0xffffffff & bVar6) == 1) {
      pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_140,"ERROR: Indentation-sensitive language has no NEWLINE token\n"
                 ,(allocator *)&parser);
      ParserFail::ParserFail(pPVar4,(string *)&local_140);
      __cxa_throw(pPVar4,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (((int)uVar2 <= (int)uVar7) && ((int)uVar2 <= iVar8)) {
      build_grammar((Omega_h *)&grammar,language);
      std::__shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_d0,
                 &grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>);
      build_lalr1_parser(&local_140,(GrammarPtr *)&local_d0,false);
      accept_parser(&parser,&local_140);
      ParserInProgress::~ParserInProgress(&local_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
      __p = (ReaderTables *)operator_new(0xa0);
      Parser::Parser((Parser *)__p,&parser);
      FiniteAutomaton::FiniteAutomaton(&__p->lexer,&lexer);
      uVar3 = (ulong)bVar6 | (ulong)uVar7 << 0x20;
      uVar5 = uVar5 | (ulong)uVar2 << 0x20;
      (__p->indent_info).is_sensitive = (bool)(char)uVar3;
      *(int3 *)&(__p->indent_info).field_0x1 = (int3)(uVar3 >> 8);
      (__p->indent_info).indent_token = (int)(uVar3 >> 0x20);
      (__p->indent_info).dedent_token = (int)uVar5;
      (__p->indent_info).newline_token = (int)(uVar5 >> 0x20);
      std::__shared_ptr<Omega_h::ReaderTables_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Omega_h::ReaderTables,void>
                ((__shared_ptr<Omega_h::ReaderTables_const,(__gnu_cxx::_Lock_policy)2> *)this,__p);
      Parser::~Parser(&parser);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      FiniteAutomaton::~FiniteAutomaton(&lexer);
      RVar9.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      RVar9.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (ReaderTablesPtr)
             RVar9.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
    }
    pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_140,"ERROR: NEWLINE needs to come before all other indent tokens\n",
               (allocator *)&parser);
    ParserFail::ParserFail(pPVar4,(string *)&local_140);
    __cxa_throw(pPVar4,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_140,"ERROR: Indentation-sensitive language has no DEDENT token\n",
             (allocator *)&parser);
  ParserFail::ParserFail(pPVar4,(string *)&local_140);
  __cxa_throw(pPVar4,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ReaderTablesPtr build_reader_tables(Language const& language) {
  auto lexer = build_lexer(language);
  auto indent_info = build_indent_info(language);
  auto grammar = build_grammar(language);
  auto parser = accept_parser(build_lalr1_parser(grammar));
  return ReaderTablesPtr(new ReaderTables({parser, lexer, indent_info}));
}